

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O1

pic_buf_t * ihevc_dpb_mgr_get_ref_by_nearest_poc(dpb_mgr_t *ps_dpb_mgr,WORD32 cur_abs_poc)

{
  pic_buf_t *ppVar1;
  pic_buf_t *ppVar2;
  pic_buf_t *ppVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar5 = 0x7fffffff;
  lVar4 = 0;
  ppVar2 = (pic_buf_t *)0x0;
  do {
    ppVar1 = *(pic_buf_t **)((long)&ps_dpb_mgr->as_dpb_info[0].ps_pic_buf + lVar4);
    ppVar3 = ppVar2;
    iVar6 = iVar5;
    if (((ppVar1 != (pic_buf_t *)0x0) && (ppVar1->u1_used_as_ref != '\0')) &&
       (iVar6 = cur_abs_poc - ppVar1->i4_abs_poc, ppVar3 = ppVar1, iVar6 < 1 || iVar5 <= iVar6)) {
      ppVar3 = ppVar2;
      iVar6 = iVar5;
    }
    iVar5 = iVar6;
    lVar4 = lVar4 + 0x10;
    ppVar2 = ppVar3;
  } while (lVar4 != 0x400);
  if (ppVar3 == (pic_buf_t *)0x0) {
    iVar5 = 0x7fffffff;
    lVar4 = 0;
    ppVar3 = (pic_buf_t *)0x0;
    do {
      ppVar2 = *(pic_buf_t **)((long)&ps_dpb_mgr->as_dpb_info[0].ps_pic_buf + lVar4);
      if ((ppVar2 != (pic_buf_t *)0x0) && (ppVar2->u1_used_as_ref != '\0')) {
        iVar7 = cur_abs_poc - ppVar2->i4_abs_poc;
        iVar6 = -iVar7;
        if (0 < iVar7) {
          iVar6 = iVar7;
        }
        if (iVar6 < iVar5) {
          ppVar3 = ppVar2;
          iVar5 = iVar6;
        }
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
  }
  return ppVar3;
}

Assistant:

pic_buf_t* ihevc_dpb_mgr_get_ref_by_nearest_poc(dpb_mgr_t *ps_dpb_mgr, WORD32 cur_abs_poc)
{
    WORD32 i;
    WORD32 min_diff = 0x7FFFFFFF;
    pic_buf_t *ps_pic_buf = NULL;

    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf) &&
                        (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf->u1_used_as_ref != UNUSED_FOR_REF))
        {
            WORD32 poc_diff = cur_abs_poc - ps_dpb_mgr->as_dpb_info[i].ps_pic_buf->i4_abs_poc;
            if((poc_diff > 0) && (poc_diff < min_diff))
            {
                min_diff = poc_diff;
                ps_pic_buf = ps_dpb_mgr->as_dpb_info[i].ps_pic_buf;
            }
        }
    }

    if(NULL == ps_pic_buf)
    {
        min_diff = 0x7FFFFFFF;
        for(i = 0; i < MAX_DPB_BUFS; i++)
        {
            if((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf) &&
                            (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf->u1_used_as_ref != UNUSED_FOR_REF))
            {
                WORD32 poc_diff = cur_abs_poc - ps_dpb_mgr->as_dpb_info[i].ps_pic_buf->i4_abs_poc;
                if(ABS(poc_diff) < min_diff)
                {
                    min_diff = ABS(poc_diff);
                    ps_pic_buf = ps_dpb_mgr->as_dpb_info[i].ps_pic_buf;
                }
            }
        }
    }

    return ps_pic_buf;
}